

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void stack_init(lua_State *L1,lua_State *L)

{
  CallInfo *pCVar1;
  StkId pTVar2;
  lua_State *L_local;
  lua_State *L1_local;
  
  pCVar1 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x140);
  L1->base_ci = pCVar1;
  L1->ci = L1->base_ci;
  L1->size_ci = 8;
  L1->end_ci = L1->base_ci + (long)L1->size_ci + -1;
  pTVar2 = (StkId)luaM_realloc_(L,(void *)0x0,0,0x2d0);
  L1->stack = pTVar2;
  L1->stacksize = 0x2d;
  L1->top = L1->stack;
  L1->stack_last = L1->stack + (long)(L1->stacksize + -5) + -1;
  L1->ci->func = L1->top;
  pTVar2 = L1->top;
  L1->top = pTVar2 + 1;
  pTVar2->tt = 0;
  pTVar2 = L1->top;
  L1->ci->base = pTVar2;
  L1->base = pTVar2;
  L1->ci->top = L1->top + 0x14;
  return;
}

Assistant:

static void stack_init(lua_State*L1,lua_State*L){
L1->base_ci=luaM_newvector(L,8,CallInfo);
L1->ci=L1->base_ci;
L1->size_ci=8;
L1->end_ci=L1->base_ci+L1->size_ci-1;
L1->stack=luaM_newvector(L,(2*20)+5,TValue);
L1->stacksize=(2*20)+5;
L1->top=L1->stack;
L1->stack_last=L1->stack+(L1->stacksize-5)-1;
L1->ci->func=L1->top;
setnilvalue(L1->top++);
L1->base=L1->ci->base=L1->top;
L1->ci->top=L1->top+20;
}